

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O1

MSize lj_serialize_peektype(SBufExt *sbx)

{
  byte *pbVar1;
  char *pcVar2;
  MSize MVar3;
  uint32_t tp;
  
  pbVar1 = (byte *)sbx->r;
  MVar3 = 0;
  if ((pbVar1 < sbx->w) &&
     ((tp = (uint32_t)*pbVar1, tp < 0xe0 ||
      (pcVar2 = serialize_ru124_((char *)(pbVar1 + 1),sbx->w,&tp), MVar3 = 0, pcVar2 != (char *)0x0)
      ))) {
    if ((ulong)tp < 0x13) {
      MVar3 = *(MSize *)(&DAT_00165904 + (ulong)tp * 4);
    }
    else {
      MVar3 = 4;
    }
  }
  return MVar3;
}

Assistant:

LJ_FASTCALL lj_serialize_peektype(SBufExt *sbx)
{
  uint32_t tp;
  if (serialize_ru124(sbx->r, sbx->w, &tp)) {
    /* This must match the handling of all tags in the decoder above. */
    switch (tp) {
    case SER_TAG_NIL: return IRT_NIL;
    case SER_TAG_FALSE: return IRT_FALSE;
    case SER_TAG_TRUE: return IRT_TRUE;
    case SER_TAG_NULL: case SER_TAG_LIGHTUD32: case SER_TAG_LIGHTUD64:
      return IRT_LIGHTUD;
    case SER_TAG_INT: return LJ_DUALNUM ? IRT_INT : IRT_NUM;
    case SER_TAG_NUM: return IRT_NUM;
    case SER_TAG_TAB: case SER_TAG_TAB+1: case SER_TAG_TAB+2:
    case SER_TAG_TAB+3: case SER_TAG_TAB+4: case SER_TAG_TAB+5:
    case SER_TAG_DICT_MT:
      return IRT_TAB;
    case SER_TAG_INT64: case SER_TAG_UINT64: case SER_TAG_COMPLEX:
      return IRT_CDATA;
    case SER_TAG_DICT_STR:
    default:
      return IRT_STR;
    }
  }
  return IRT_NIL;  /* Will fail on actual decode. */
}